

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathCastNodeSetToString(xmlNodeSetPtr ns)

{
  xmlNodeSetPtr ns_local;
  
  if (((ns == (xmlNodeSetPtr)0x0) || (ns->nodeNr == 0)) || (ns->nodeTab == (xmlNodePtr *)0x0)) {
    ns_local = (xmlNodeSetPtr)xmlStrdup("");
  }
  else {
    if (1 < ns->nodeNr) {
      xmlXPathNodeSetSort(ns);
    }
    ns_local = (xmlNodeSetPtr)xmlXPathCastNodeToString(*ns->nodeTab);
  }
  return (xmlChar *)ns_local;
}

Assistant:

xmlChar *
xmlXPathCastNodeSetToString (xmlNodeSetPtr ns) {
    if ((ns == NULL) || (ns->nodeNr == 0) || (ns->nodeTab == NULL))
	return(xmlStrdup((const xmlChar *) ""));

    if (ns->nodeNr > 1)
	xmlXPathNodeSetSort(ns);
    return(xmlXPathCastNodeToString(ns->nodeTab[0]));
}